

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fan_calculator.cpp
# Opt level: O3

bool mahjong::is_division_branch_exist
               (intptr_t fixed_cnt,intptr_t step,division_t *work_division,division_result_t *result
               )

{
  division_result_t *pdVar1;
  bool bVar2;
  long lVar3;
  undefined1 *__dest;
  division_result_t *__it;
  ulong uVar4;
  long lVar5;
  long lVar6;
  division_t temp;
  undefined1 local_5a [10];
  undefined1 *local_50;
  intptr_t local_48;
  intptr_t local_40;
  division_result_t *local_38;
  
  if (step < 3) {
    return false;
  }
  if (result->count < 1) {
    return false;
  }
  __dest = local_5a + fixed_cnt * 2;
  memcpy(__dest,work_division->packs + fixed_cnt,step * 2);
  uVar4 = step * 2 >> 1;
  lVar3 = 0x3f;
  if (uVar4 != 0) {
    for (; uVar4 >> lVar3 == 0; lVar3 = lVar3 + -1) {
    }
  }
  std::__introsort_loop<unsigned_short*,long,__gnu_cxx::__ops::_Iter_less_iter>
            (__dest,local_5a + (step + fixed_cnt) * 2,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
  std::__final_insertion_sort<unsigned_short*,__gnu_cxx::__ops::_Iter_less_iter>
            (__dest,local_5a + (step + fixed_cnt) * 2);
  lVar3 = result->count;
  pdVar1 = (division_result_t *)(result->divisions + lVar3);
  local_50 = local_5a;
  lVar5 = lVar3 >> 2;
  local_48 = fixed_cnt;
  local_40 = step;
  if (0 < lVar5) {
    local_38 = (division_result_t *)(result->divisions + lVar5 * 4);
    lVar6 = lVar5 + 1;
    do {
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<mahjong::is_division_branch_exist(long,long,mahjong::(anonymous_namespace)::division_t_const*,mahjong::(anonymous_namespace)::division_result_t_const*)::$_0>
              ::operator()((_Iter_pred<mahjong::is_division_branch_exist(long,long,mahjong::(anonymous_namespace)::division_t_const*,mahjong::(anonymous_namespace)::division_result_t_const*)::__0>
                            *)&local_50,result->divisions);
      __it = result;
      if (bVar2) goto LAB_0011e89b;
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<mahjong::is_division_branch_exist(long,long,mahjong::(anonymous_namespace)::division_t_const*,mahjong::(anonymous_namespace)::division_result_t_const*)::$_0>
              ::operator()((_Iter_pred<mahjong::is_division_branch_exist(long,long,mahjong::(anonymous_namespace)::division_t_const*,mahjong::(anonymous_namespace)::division_result_t_const*)::__0>
                            *)&local_50,result->divisions + 1);
      __it = (division_result_t *)(result->divisions + 1);
      if (bVar2) goto LAB_0011e89b;
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<mahjong::is_division_branch_exist(long,long,mahjong::(anonymous_namespace)::division_t_const*,mahjong::(anonymous_namespace)::division_result_t_const*)::$_0>
              ::operator()((_Iter_pred<mahjong::is_division_branch_exist(long,long,mahjong::(anonymous_namespace)::division_t_const*,mahjong::(anonymous_namespace)::division_result_t_const*)::__0>
                            *)&local_50,result->divisions + 2);
      __it = (division_result_t *)(result->divisions + 2);
      if (bVar2) goto LAB_0011e89b;
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<mahjong::is_division_branch_exist(long,long,mahjong::(anonymous_namespace)::division_t_const*,mahjong::(anonymous_namespace)::division_result_t_const*)::$_0>
              ::operator()((_Iter_pred<mahjong::is_division_branch_exist(long,long,mahjong::(anonymous_namespace)::division_t_const*,mahjong::(anonymous_namespace)::division_result_t_const*)::__0>
                            *)&local_50,result->divisions + 3);
      __it = (division_result_t *)(result->divisions + 3);
      if (bVar2) goto LAB_0011e89b;
      result = (division_result_t *)(result->divisions + 4);
      lVar6 = lVar6 + -1;
    } while (1 < lVar6);
    lVar3 = (lVar3 * 10 + lVar5 * -0x28 >> 1) * -0x3333333333333333;
    result = local_38;
  }
  if (lVar3 != 1) {
    __it = result;
    if (lVar3 != 2) {
      __it = pdVar1;
      if ((lVar3 != 3) ||
         (bVar2 = __gnu_cxx::__ops::
                  _Iter_pred<mahjong::is_division_branch_exist(long,long,mahjong::(anonymous_namespace)::division_t_const*,mahjong::(anonymous_namespace)::division_result_t_const*)::$_0>
                  ::operator()((_Iter_pred<mahjong::is_division_branch_exist(long,long,mahjong::(anonymous_namespace)::division_t_const*,mahjong::(anonymous_namespace)::division_result_t_const*)::__0>
                                *)&local_50,result->divisions), __it = result, bVar2))
      goto LAB_0011e89b;
      __it = (division_result_t *)(result->divisions + 1);
    }
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<mahjong::is_division_branch_exist(long,long,mahjong::(anonymous_namespace)::division_t_const*,mahjong::(anonymous_namespace)::division_result_t_const*)::$_0>
            ::operator()((_Iter_pred<mahjong::is_division_branch_exist(long,long,mahjong::(anonymous_namespace)::division_t_const*,mahjong::(anonymous_namespace)::division_result_t_const*)::__0>
                          *)&local_50,__it->divisions);
    if (bVar2) goto LAB_0011e89b;
    result = (division_result_t *)(__it->divisions + 1);
  }
  bVar2 = __gnu_cxx::__ops::
          _Iter_pred<mahjong::is_division_branch_exist(long,long,mahjong::(anonymous_namespace)::division_t_const*,mahjong::(anonymous_namespace)::division_result_t_const*)::$_0>
          ::operator()((_Iter_pred<mahjong::is_division_branch_exist(long,long,mahjong::(anonymous_namespace)::division_t_const*,mahjong::(anonymous_namespace)::division_result_t_const*)::__0>
                        *)&local_50,result->divisions);
  __it = result;
  if (!bVar2) {
    __it = pdVar1;
  }
LAB_0011e89b:
  return __it != pdVar1;
}

Assistant:

static bool is_division_branch_exist(intptr_t fixed_cnt, intptr_t step, const division_t *work_division, const division_result_t *result) {
    // 没有划分时，以及划分步骤小于3时，不检测，因为至少要有3步递归才会产生不同划分
    if (result->count <= 0 || step < 3) {
        return false;
    }

    // std::includes要求有序
    // 这里不能直接在work_division->packs上排序，否则会破坏递归外层的数据
    division_t temp;
    memcpy(&temp.packs[fixed_cnt], &work_division->packs[fixed_cnt], step * sizeof(pack_t));
    std::sort(&temp.packs[fixed_cnt], &temp.packs[fixed_cnt + step]);

    // 只需要比较面子是否重复分支，雀头不参与比较，所以下标是4
    return std::any_of(&result->divisions[0], &result->divisions[result->count],
        [&temp, fixed_cnt, step](const division_t &od) {
        return std::includes(&od.packs[fixed_cnt], &od.packs[4], &temp.packs[fixed_cnt], &temp.packs[fixed_cnt + step]);
    });
}